

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local.h
# Opt level: O3

TVMRuntimeEntry * dmlc::ThreadLocalStore<TVMRuntimeEntry>::Get(void)

{
  long *in_FS_OFFSET;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    Get();
  }
  return (TVMRuntimeEntry *)(*in_FS_OFFSET + -0x58);
}

Assistant:

static T *Get() {
#if DMLC_CXX11_THREAD_LOCAL
    static thread_local T inst;
    return &inst;
#else
    static MX_THREAD_LOCAL T *ptr = nullptr;
    if (ptr == nullptr) {
      ptr = new T();
      Singleton()->RegisterDelete(ptr);
    }
    return ptr;
#endif
  }